

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

bool __thiscall cppnet::Bitmap::Init(Bitmap *this,uint32_t size)

{
  pointer plVar1;
  pointer plVar2;
  size_t i;
  long lVar3;
  
  if (size < 0x840) {
    std::vector<long,_std::allocator<long>_>::resize
              (&this->_bitmap,(ulong)(((size >> 6) + 1) - (uint)((size & 0x3f) == 0)));
    plVar1 = (this->_bitmap).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar2 = (this->_bitmap).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (lVar3 = 0; (long)plVar2 - (long)plVar1 >> 3 != lVar3; lVar3 = lVar3 + 1) {
      plVar1[lVar3] = 0;
    }
  }
  return size < 0x840;
}

Assistant:

bool Bitmap::Init(uint32_t size) {
    uint32_t vec_size = size / __step_size;
    // too large size
    if (vec_size > sizeof(_vec_bitmap) * 8) {
        return false;
    }
    if (size % __step_size > 0) {
        vec_size++;
    }
    _bitmap.resize(vec_size);
    for (std::size_t i = 0; i < _bitmap.size(); i++) {
        _bitmap[i] = 0;
    }
    return true;
}